

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlindex.cpp
# Opt level: O0

QSqlIndex * __thiscall QSqlIndex::operator=(QSqlIndex *this,QSqlIndex *other)

{
  QList<bool> *in_RSI;
  QSqlIndex *in_RDI;
  
  QString::operator=(&in_RDI->cursor,(QString *)&(in_RSI->d).ptr);
  QString::operator=(&in_RDI->nm,(QString *)&in_RSI[1].d.ptr);
  QList<bool>::operator=(in_RSI,(QList<bool> *)in_RDI);
  QSqlRecord::operator=((QSqlRecord *)in_RSI,&in_RDI->super_QSqlRecord);
  return in_RDI;
}

Assistant:

QSqlIndex& QSqlIndex::operator=(const QSqlIndex& other)
{
    cursor = other.cursor;
    nm = other.nm;
    sorts = other.sorts;
    QSqlRecord::operator=(other);
    return *this;
}